

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O0

bool __thiscall
Ruleset::containsType(Ruleset *this,vector<Card,_std::allocator<Card>_> *cards,Card *card)

{
  bool bVar1;
  Suit SVar2;
  Suit SVar3;
  reference pCVar4;
  Card local_48;
  Card c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Card,_std::allocator<Card>_> *__range1;
  Card *card_local;
  vector<Card,_std::allocator<Card>_> *cards_local;
  Ruleset *this_local;
  
  bVar1 = isTrump(this,card);
  if (bVar1) {
    this_local._7_1_ = containsTrump(this,cards);
  }
  else {
    __end1 = std::vector<Card,_std::allocator<Card>_>::begin(cards);
    c = (Card)std::vector<Card,_std::allocator<Card>_>::end(cards);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_>
                                       *)&c), bVar1) {
      pCVar4 = __gnu_cxx::__normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_>
               ::operator*(&__end1);
      local_48 = *pCVar4;
      bVar1 = isTrump(this,&local_48);
      if (!bVar1) {
        SVar2 = Card::suit(&local_48);
        SVar3 = Card::suit(card);
        if (SVar2 == SVar3) {
          return true;
        }
      }
      __gnu_cxx::__normal_iterator<const_Card_*,_std::vector<Card,_std::allocator<Card>_>_>::
      operator++(&__end1);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Ruleset::containsType(const std::vector<Card> &cards, const Card &card) {
    if (isTrump(card))
        return containsTrump(cards);
    for (Card c: cards)
        if (!isTrump(c) && c.suit() == card.suit())
            return true;
    return false;
}